

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::main(void)

{
  float fVar1;
  float *pfVar2;
  long *plVar3;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this;
  TPZFMatrix<float> *this_00;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this_01;
  TPZVec<long> *destinationindex;
  TPZVec<int> NumConnected;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> TestFront;
  TPZVec<long> DestInd3;
  TPZFMatrix<float> KEl3;
  TPZVec<long> DestInd2;
  int j;
  int i;
  TPZFMatrix<float> KEl2;
  TPZVec<long> DestInd1;
  TPZFMatrix<float> KEl1;
  TPZVec<long> *in_stack_00001d90;
  TPZFMatrix<float> *in_stack_00001d98;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *in_stack_00001da0;
  int64_t in_stack_fffffffffffffa68;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *in_stack_fffffffffffffa70
  ;
  int64_t in_stack_fffffffffffffa80;
  int64_t in_stack_fffffffffffffa88;
  TPZFMatrix<float> *in_stack_fffffffffffffa90;
  int64_t in_stack_fffffffffffffaa0;
  int64_t in_stack_fffffffffffffaa8;
  TPZFMatrix<float> *in_stack_fffffffffffffab0;
  TPZVec<int> local_498 [19];
  TPZVec<long> local_228 [5];
  TPZVec<long> local_178;
  int local_158;
  int local_154;
  TPZVec<long> local_c0 [6];
  
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 4.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 12.0;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  plVar3 = TPZVec<long>::operator[](local_c0,0);
  *plVar3 = 0;
  plVar3 = TPZVec<long>::operator[](local_c0,1);
  *plVar3 = 1;
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 4.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = -6.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 2.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 12.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = -6.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = -12.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 4.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 12.0;
  for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
    for (local_158 = local_154; local_158 < 4; local_158 = local_158 + 1) {
      pfVar2 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                          in_stack_fffffffffffffa80);
      fVar1 = *pfVar2;
      pfVar2 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                          in_stack_fffffffffffffa80);
      *pfVar2 = fVar1;
    }
  }
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  plVar3 = TPZVec<long>::operator[](&local_178,0);
  *plVar3 = 0;
  plVar3 = TPZVec<long>::operator[](&local_178,1);
  *plVar3 = 1;
  this = (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *)
         TPZVec<long>::operator[](&local_178,2);
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x2;
  plVar3 = TPZVec<long>::operator[](&local_178,3);
  *plVar3 = 3;
  TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)this,(int64_t)plVar3,in_stack_fffffffffffffaa0)
  ;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 3.0;
  pfVar2 = TPZFMatrix<float>::operator()
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80)
  ;
  *pfVar2 = 3.0;
  this_00 = (TPZFMatrix<float> *)
            TPZFMatrix<float>::operator()
                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
                      );
  *(undefined4 *)
   &(this_00->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       0x40400000;
  pfVar2 = TPZFMatrix<float>::operator()
                     (this_00,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  *pfVar2 = 6.0;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  this_01 = (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *)
            TPZVec<long>::operator[](local_228,0);
  (this_01->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x2;
  destinationindex = (TPZVec<long> *)TPZVec<long>::operator[](local_228,1);
  destinationindex->_vptr_TPZVec = (_func_int **)0x3;
  TPZFrontMatrix(this,(int64_t)plVar3);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
    in_stack_fffffffffffffa70 =
         (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *)
         TPZVec<int>::operator[](local_498,(long)local_154);
    *(int *)&(in_stack_fffffffffffffa70->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>
             .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = 2;
  }
  SetNumElConnected(this_01,(TPZVec<int> *)destinationindex);
  SymbolicAddKel(this_01,destinationindex);
  SymbolicAddKel(this_01,destinationindex);
  SymbolicAddKel(this_01,destinationindex);
  AllocData(in_stack_fffffffffffffa70);
  SetNumElConnected(this_01,(TPZVec<int> *)destinationindex);
  AddKel(in_stack_00001da0,in_stack_00001d98,in_stack_00001d90);
  AddKel(in_stack_00001da0,in_stack_00001d98,in_stack_00001d90);
  AddKel(in_stack_00001da0,in_stack_00001d98,in_stack_00001d90);
  TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_fffffffffffffa70);
  ~TPZFrontMatrix((TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *)
                  0x1cd783d);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffa70);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1cd7857);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffa70);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1cd7871);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffa70);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1cd788b);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}